

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

int __thiscall
flow::PhiNode::clone(PhiNode *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Instr *this_00;
  
  this_00 = (Instr *)operator_new(0x68);
  Instr::Instr(this_00,*(LiteralType *)(**(long **)(__fn + 0x50) + 8),
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)(__fn + 0x50),
               (string *)(__fn + 0x10));
  (this_00->super_Value)._vptr_Value = (_func_int **)&PTR__Instr_001b1428;
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> PhiNode::clone() {
  return std::make_unique<PhiNode>(operands(), name());
}